

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_all.hpp
# Opt level: O2

tuple<int,_int>
burst::detail::
by_all_impl<0ul,1ul,burst::front_t,std::tuple<boost::iterator_range<boost::range_detail::integer_iterator<int>>&,boost::iterator_range<boost::range_detail::integer_iterator<int>>&>>
          (_Tuple_impl<0UL,_int,_int> param_1,undefined8 param_2,undefined8 *param_3)

{
  reference rVar1;
  reference rVar2;
  
  rVar1 = boost::iterator_range_detail::
          iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          ::front((iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                   *)param_3[1]);
  rVar2 = boost::iterator_range_detail::
          iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          ::front((iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                   *)*param_3);
  *(reference *)param_1 = rVar2;
  *(reference *)((long)param_1 + 4) = rVar1;
  return (tuple<int,_int>)param_1;
}

Assistant:

constexpr decltype(auto)
            by_all_impl (std::index_sequence<Indices...>, UnaryFunction & f, Tuple && t)
        {
            return
                std::tuple
                <
                    invoke_result_t
                    <
                        UnaryFunction &, std::tuple_element_t<Indices, std::decay_t<Tuple>>
                    >...
                >
                (
                    f(std::get<Indices>(std::forward<Tuple>(t)))...
                );
        }